

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O3

void __thiscall HDual::setCrash(HDual *this,char *Crash_ArgV)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  
  iVar1 = strcmp(Crash_ArgV,"Off");
  iVar3 = 0;
  if (iVar1 != 0) {
    iVar1 = strcmp(Crash_ArgV,"LTSSF");
    iVar3 = 2;
    if (iVar1 != 0) {
      iVar1 = strcmp(Crash_ArgV,"LTSSF1");
      if (iVar1 == 0) {
        iVar3 = 1;
      }
      else {
        iVar1 = strcmp(Crash_ArgV,"LTSSF2");
        if (iVar1 != 0) {
          iVar1 = strcmp(Crash_ArgV,"LTSSF3");
          if (iVar1 == 0) {
            iVar3 = 3;
          }
          else {
            iVar1 = strcmp(Crash_ArgV,"LTSSF4");
            if (iVar1 == 0) {
              iVar3 = 4;
            }
            else {
              iVar1 = strcmp(Crash_ArgV,"LTSSF5");
              if (iVar1 == 0) {
                iVar3 = 5;
              }
              else {
                iVar1 = strcmp(Crash_ArgV,"LTSSF6");
                if (iVar1 == 0) {
                  iVar3 = 6;
                }
                else {
                  iVar1 = strcmp(Crash_ArgV,"LTSSF7");
                  if (iVar1 == 0) {
                    iVar3 = 7;
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"HDual::setCrash unrecognised CrashArgV = ",
                               0x29);
                    poVar2 = std::operator<<((ostream *)&std::cout,Crash_ArgV);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar2," - using No crash",0x11);
                    std::endl<char,std::char_traits<char>>(poVar2);
                    iVar3 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  this->Crash_Mode = iVar3;
  return;
}

Assistant:

void HDual::setCrash(const char *Crash_ArgV) {
  //	cout << "HDual::setCrash Crash_ArgV = " << Crash_ArgV << endl;
	if (strcmp(Crash_ArgV, "Off") == 0)
		Crash_Mode = Crash_Mode_No;
	else if (strcmp(Crash_ArgV, "LTSSF") == 0)
		Crash_Mode = Crash_Mode_Df;
	else if (strcmp(Crash_ArgV, "LTSSF1") == 0)
		Crash_Mode = Crash_Mode_LTSSF_k;
	else if (strcmp(Crash_ArgV, "LTSSF2") == 0)
		Crash_Mode = Crash_Mode_LTSSF_pri;
	else if (strcmp(Crash_ArgV, "LTSSF3") == 0)
		Crash_Mode = Crash_Mode_LTSF_k;
	else if (strcmp(Crash_ArgV, "LTSSF4") == 0)
		Crash_Mode = Crash_Mode_LTSF_pri;
	else if (strcmp(Crash_ArgV, "LTSSF5") == 0)
		Crash_Mode = Crash_Mode_LTSF;
	else if (strcmp(Crash_ArgV, "LTSSF6") == 0)
		Crash_Mode = Crash_Mode_Bixby;
	else if (strcmp(Crash_ArgV, "LTSSF7") == 0)
		Crash_Mode = Crash_Mode_Dev;
	else {
		cout << "HDual::setCrash unrecognised CrashArgV = " << Crash_ArgV
				<< " - using No crash" << endl;
		Crash_Mode = Crash_Mode_No;
	}
//	if (Crash_Mode == Crash_Mode_LTSSF) {
//		crash.ltssf_iz_mode(Crash_Mode);
//	}
//		cout<<"HDual::setCrash Crash_Mode = " << Crash_Mode << endl;
}